

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# persistent_storage_json.cpp
# Opt level: O0

Status __thiscall
ot::commissioner::persistent_storage::PersistentStorageJson::Add
          (PersistentStorageJson *this,Network *aValue,NetworkId *aRetId)

{
  Status SVar1;
  string local_60;
  string local_40;
  NetworkId *local_20;
  NetworkId *aRetId_local;
  Network *aValue_local;
  PersistentStorageJson *this_local;
  
  local_20 = aRetId;
  aRetId_local = &aValue->mId;
  aValue_local = (Network *)this;
  std::__cxx11::string::string((string *)&local_40,(string *)JSON_NWK_SEQ_abi_cxx11_);
  std::__cxx11::string::string((string *)&local_60,(string *)JSON_NWK_abi_cxx11_);
  SVar1 = AddOne<ot::commissioner::persistent_storage::Network,ot::commissioner::persistent_storage::NetworkId>
                    (this,aValue,aRetId,&local_40,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  return SVar1;
}

Assistant:

PersistentStorage::Status PersistentStorageJson::Add(Network const &aValue, NetworkId &aRetId)
{
    return AddOne<Network, NetworkId>(aValue, aRetId, JSON_NWK_SEQ, JSON_NWK);
}